

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::SimpleTypeHandler<2UL>::SetIsPrototype(SimpleTypeHandler<2UL> *this,DynamicObject *instance)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  SimpleDictionaryTypeHandler *pSVar1;
  undefined8 extraout_RDX;
  
  if ((DAT_0145c366 == '\0') &&
     ((((this->super_DynamicTypeHandler).flags & 0x18) == 0 || (DAT_0145c365 != '\x01')))) {
    return;
  }
  pSVar1 = ConvertToSimpleDictionaryType(this,instance);
  UNRECOVERED_JUMPTABLE = (pSVar1->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x52];
  (*UNRECOVERED_JUMPTABLE)(pSVar1,instance,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void SimpleTypeHandler<size>::SetIsPrototype(DynamicObject* instance)
    {
        // Don't return if IsPrototypeFlag is set, because we may still need to do a type transition and
        // set fixed bits.  If this handler is shared, this instance may not even be a prototype yet.
        // In this case we may need to convert to a non-shared type handler.
        if (!ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            return;
        }

        ConvertToSimpleDictionaryType(instance)->SetIsPrototype(instance);
    }